

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

bool __thiscall slang::ast::LookupResult::hasError(LookupResult *this)

{
  size_type sVar1;
  bool bVar2;
  Diagnostic *diag;
  Diagnostic *this_00;
  long lVar3;
  
  if ((this->found != (Symbol *)0x0) || (bVar2 = true, ((this->flags).m_bits & 5) == 0)) {
    sVar1 = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
            super_SmallVectorBase<slang::Diagnostic>.len;
    if (sVar1 == 0) {
      return false;
    }
    this_00 = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.data_;
    lVar3 = sVar1 * 0x70;
    do {
      lVar3 = lVar3 + -0x70;
      bVar2 = Diagnostic::isError(this_00);
      if (bVar2) {
        return bVar2;
      }
      this_00 = this_00 + 1;
    } while (lVar3 != 0);
  }
  return bVar2;
}

Assistant:

bool LookupResult::hasError() const {
    // We have an error if we have any diagnostics or if there was a missing explicit import.
    if (!found && flags.has(LookupResultFlags::WasImported | LookupResultFlags::SuppressUndeclared))
        return true;

    for (auto& diag : diagnostics) {
        if (diag.isError())
            return true;
    }

    return false;
}